

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_sse_sum.c
# Opt level: O0

void aom_get_blk_sse_sum_c(int16_t *data,int stride,int bw,int bh,int *x_sum,int64_t *x2_sum)

{
  int iVar1;
  int val;
  int j;
  int i;
  int64_t *x2_sum_local;
  int *x_sum_local;
  int bh_local;
  int bw_local;
  int stride_local;
  int16_t *data_local;
  
  *x_sum = 0;
  *x2_sum = 0;
  data_local = data;
  for (i = 0; i < bh; i = i + 1) {
    for (j = 0; j < bw; j = j + 1) {
      iVar1 = (int)data_local[j];
      *x_sum = iVar1 + *x_sum;
      *x2_sum = (long)(iVar1 * iVar1) + *x2_sum;
    }
    data_local = data_local + stride;
  }
  return;
}

Assistant:

void aom_get_blk_sse_sum_c(const int16_t *data, int stride, int bw, int bh,
                           int *x_sum, int64_t *x2_sum) {
  *x_sum = 0;
  *x2_sum = 0;
  for (int i = 0; i < bh; ++i) {
    for (int j = 0; j < bw; ++j) {
      const int val = data[j];
      *x_sum += val;
      *x2_sum += val * val;
    }
    data += stride;
  }
}